

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall
MxxColl_AllgatherOne_Test::MxxColl_AllgatherOne_Test(MxxColl_AllgatherOne_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001aa5d0;
  return;
}

Assistant:

TEST(MxxColl, AllgatherOne) {
    mxx::comm c;
    std::pair<int,double> x = std::make_pair(13*c.rank(), 3.141/c.rank());
    // allgather
    std::vector<std::pair<int, double> > pairs = mxx::allgather(x);

    ASSERT_EQ(c.size(), (int)pairs.size());
    for (int i = 0; i < c.size(); ++i)
    {
        ASSERT_EQ(13*i, pairs[i].first);
        ASSERT_EQ(3.141/i, pairs[i].second);
    }
}